

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafika2.cpp
# Opt level: O0

void * inc_x(void *x_void_ptr)

{
  int iVar1;
  int cmd;
  void *x_void_ptr_local;
  
  while( true ) {
    while (iVar1 = getch(), iVar1 != 0x1b) {
      if (((iVar1 == 0x61) || (iVar1 == 0x41)) || (iVar1 == -4)) {
        if (0 < targetx) {
          targetx = targetx + -10;
        }
      }
      else if (((iVar1 == 100) || (iVar1 == 0x44)) || (iVar1 == -3)) {
        if (targetx < 0x556) {
          targetx = targetx + 10;
        }
      }
      else if (((iVar1 == 0x71) || (iVar1 == 0x71)) || (iVar1 == -1)) {
        if (0 < tembakanx) {
          tembakanx = tembakanx + -10;
        }
      }
      else if ((((iVar1 == 0x65) || (iVar1 == 0x45)) || (iVar1 == -2)) && (tembakanx < 0x556)) {
        tembakanx = tembakanx + 10;
      }
    }
    iVar1 = getch();
    if (iVar1 == 0x1b) break;
    if (iVar1 == 0x5b) {
      getch();
    }
  }
  return (void *)0x0;
}

Assistant:

void *inc_x(void *x_void_ptr)
{    
  int cmd = ' ';
  while(true){
   cmd = getch();
    if (cmd == 27) {
       cmd = getch();
       if (cmd == 27) {
         break;
       }
       else if (cmd == 91) {
         cmd = getch();
         cmd = 64 - cmd;
       }
     }
     else if (cmd == 'a' || cmd == 'A' || cmd == -4) {
       if(targetx>0)
       targetx-=10;
     }
     else if (cmd == 'd' || cmd == 'D' || cmd == -3) {
       if(targetx<1366)
       targetx+=10;
     }
     else if (cmd == 'q' || cmd == 'q' || cmd == -1) {
       if(tembakanx>0)
       tembakanx-=10;
     }
     else if (cmd == 'e' || cmd == 'E' || cmd == -2) {
       if(tembakanx<1366)
       tembakanx+=10;
     }

  }
  /* the function must return something - NULL will do */
  return NULL;

}